

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  string configurationFile;
  Restaurant rest;
  string local_a0;
  Restaurant local_80;
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_a0,argv[1],(allocator *)&local_80);
    Restaurant::Restaurant(&local_80,&local_a0);
    Restaurant::start(&local_80);
    if (backup != (Restaurant *)0x0) {
      (*backup->_vptr_Restaurant[1])();
      backup = (Restaurant *)0x0;
    }
    Restaurant::~Restaurant(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"usage: rest <config_path>");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){
    if(argc!=2){
        std::cout << "usage: rest <config_path>" << std::endl;
        return 0;
    }
    string configurationFile = argv[1];
    Restaurant rest(configurationFile);
    rest.start();
    if(backup!=nullptr){
        delete backup;
        backup = nullptr;
    }
    return 0;
}